

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::ForAllEnumValues
          (RustGenerator *this,EnumDef *enum_def,function<void_()> *cb)

{
  function<void_(const_flatbuffers::EnumVal_&)> local_68;
  anon_class_8_1_3fcf651d local_48;
  undefined1 local_40 [8];
  function<void_(const_flatbuffers::EnumVal_&)> wrapped;
  function<void_()> *cb_local;
  EnumDef *enum_def_local;
  RustGenerator *this_local;
  
  local_48.cb = cb;
  wrapped._M_invoker = (_Invoker_type)cb;
  std::function<void(flatbuffers::EnumVal_const&)>::
  function<flatbuffers::rust::RustGenerator::ForAllEnumValues(flatbuffers::EnumDef_const&,std::function<void()>)::_lambda(flatbuffers::EnumVal_const&)_1_,void>
            ((function<void(flatbuffers::EnumVal_const&)> *)local_40,&local_48);
  std::function<void_(const_flatbuffers::EnumVal_&)>::function
            (&local_68,(function<void_(const_flatbuffers::EnumVal_&)> *)local_40);
  ForAllEnumValues1(this,enum_def,&local_68);
  std::function<void_(const_flatbuffers::EnumVal_&)>::~function(&local_68);
  std::function<void_(const_flatbuffers::EnumVal_&)>::~function
            ((function<void_(const_flatbuffers::EnumVal_&)> *)local_40);
  return;
}

Assistant:

void ForAllEnumValues(const EnumDef &enum_def, std::function<void()> cb) {
    std::function<void(const EnumVal &)> wrapped = [&](const EnumVal &unused) {
      (void)unused;
      cb();
    };
    ForAllEnumValues1(enum_def, wrapped);
  }